

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * operator*(Matrix4f *__return_storage_ptr__,Matrix4f *x,Matrix4f *y)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_2c;
  undefined4 local_28;
  int k;
  int j;
  int i;
  Matrix4f *y_local;
  Matrix4f *x_local;
  Matrix4f *product;
  
  Matrix4f::Matrix4f(__return_storage_ptr__,0.0);
  for (k = 0; k < 4; k = k + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        pfVar3 = Matrix4f::operator()(x,k,local_28);
        fVar1 = *pfVar3;
        pfVar3 = Matrix4f::operator()(y,local_28,local_2c);
        fVar2 = *pfVar3;
        pfVar3 = Matrix4f::operator()(__return_storage_ptr__,k,local_2c);
        *pfVar3 = fVar1 * fVar2 + *pfVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f operator * ( const Matrix4f& x, const Matrix4f& y )
{
	Matrix4f product; // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			for( int k = 0; k < 4; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}